

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cc
# Opt level: O1

void __thiscall
phosg::expectation_failed::expectation_failed
          (expectation_failed *this,char *msg,char *file,uint64_t line)

{
  string local_48;
  
  string_printf_abi_cxx11_(&local_48,"failure at %s:%lu: %s",file,line,msg);
  ::std::logic_error::logic_error(&this->super_logic_error,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__logic_error_001259c0;
  this->msg = msg;
  this->file = file;
  this->line = line;
  return;
}

Assistant:

expectation_failed::expectation_failed(const char* msg, const char* file, uint64_t line)
    : logic_error(string_printf("failure at %s:%" PRIu64 ": %s", file, line, msg)),
      msg(msg),
      file(file),
      line(line) {}